

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

bool __thiscall
Reducer::tryToRemoveFunctions(Reducer *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *names)

{
  pointer pNVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range1;
  pointer pNVar5;
  Name NVar6;
  undefined1 local_158 [8];
  FunctionReferenceRemover referenceRemover;
  
  pNVar1 = (names->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pNVar5 = (names->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
                super__Vector_impl_data._M_start; pNVar5 != pNVar1; pNVar5 = pNVar5 + 1) {
    NVar6.super_IString.str._M_str = (char *)(pNVar5->super_IString).str._M_len;
    NVar6.super_IString.str._M_len =
         (size_t)(this->module)._M_t.
                 super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                 super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
    wasm::Module::removeFunction(NVar6);
  }
  tryToRemoveFunctions(std::vector<wasm::Name,std::allocator<wasm::Name>>)::FunctionReferenceRemover
  ::FunctionReferenceRemover(std::vector<wasm::Name,std::allocator<wasm::Name>_>__(local_158,names);
  referenceRemover.
  super_PostWalker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>.
  super_Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>.
  currFunction = (Function *)
                 (this->module)._M_t.
                 super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                 super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  tryToRemoveFunctions(std::vector<wasm::Name,std::allocator<wasm::Name>>)::FunctionReferenceRemover
  ::doWalkModule(wasm::Module__
            (local_158,
             (Module *)
             referenceRemover.
             super_PostWalker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
             .super_Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
             .currFunction);
  referenceRemover.
  super_PostWalker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>.
  super_Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>.
  currFunction = (Function *)0x0;
  cVar2 = wasm::WasmValidator::validate
                    ((Module *)
                     ((long)&referenceRemover.exportsToRemove.
                             super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7),
                     (uint)(this->module)._M_t.
                           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>
                           .super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl);
  if (cVar2 != '\0') {
    bVar3 = writeAndTestReduction(this);
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|        removed ",0x11);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      bVar3 = true;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," functions\n",0xb);
      goto LAB_0012992f;
    }
  }
  loadWorking(this);
  bVar3 = false;
LAB_0012992f:
  if (referenceRemover.names._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(referenceRemover.names._M_h._M_single_bucket,
                    (long)referenceRemover.exportsToRemove.
                          super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)referenceRemover.names._M_h._M_single_bucket);
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&referenceRemover.
                    super_PostWalker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
                    .
                    super_Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
                    .currModule);
  if (referenceRemover.
      super_PostWalker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>.
      super_Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>.stack.
      fixed._M_elems[9].currp != (Expression **)0x0) {
    operator_delete(referenceRemover.
                    super_PostWalker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
                    .
                    super_Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)referenceRemover.
                          super_PostWalker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
                          .
                          super_Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>::Task,_std::allocator<wasm::Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)referenceRemover.
                          super_PostWalker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
                          .
                          super_Walker<FunctionReferenceRemover,_wasm::Visitor<FunctionReferenceRemover,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  return bVar3;
}

Assistant:

bool tryToRemoveFunctions(std::vector<Name> names) {
    for (auto name : names) {
      module->removeFunction(name);
    }

    // remove all references to them
    struct FunctionReferenceRemover
      : public PostWalker<FunctionReferenceRemover> {
      std::unordered_set<Name> names;
      std::vector<Name> exportsToRemove;

      FunctionReferenceRemover(std::vector<Name>& vec) {
        for (auto name : vec) {
          names.insert(name);
        }
      }
      void visitCall(Call* curr) {
        if (names.count(curr->target)) {
          replaceCurrent(Builder(*getModule()).replaceWithIdenticalType(curr));
        }
      }
      void visitRefFunc(RefFunc* curr) {
        if (names.count(curr->func)) {
          replaceCurrent(Builder(*getModule()).replaceWithIdenticalType(curr));
        }
      }
      void visitExport(Export* curr) {
        if (auto* name = curr->getInternalName(); name && names.count(*name)) {
          exportsToRemove.push_back(curr->name);
        }
      }
      void doWalkModule(Module* module) {
        PostWalker<FunctionReferenceRemover>::doWalkModule(module);
        for (auto name : exportsToRemove) {
          module->removeExport(name);
        }
      }
    };
    FunctionReferenceRemover referenceRemover(names);
    referenceRemover.walkModule(module.get());

    if (WasmValidator().validate(
          *module, WasmValidator::Globally | WasmValidator::Quiet) &&
        writeAndTestReduction()) {
      std::cerr << "|        removed " << names.size() << " functions\n";
      return true;
    } else {
      loadWorking(); // restore it from orbit
      return false;
    }
  }